

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraBddCas.c
# Opt level: O1

void EvaluateEncodings_rec(DdManager *dd,DdNode *bVarsCol,int nVarsCol,int nMulti,int Level)

{
  ulong uVar1;
  DdNode *n;
  ulong uVar2;
  DdNode *n_00;
  undefined4 in_register_0000000c;
  DdNode **ppDVar3;
  DdNode *pDVar4;
  int Degree;
  ulong uVar5;
  long lVar6;
  double dVar7;
  uint nMint1;
  uint nMint0;
  uint local_70;
  uint local_6c;
  undefined8 local_68;
  DdManager *local_60;
  long local_58;
  DdNode *local_50;
  size_t local_48;
  ulong local_40;
  DdNode *local_38;
  
  local_68 = CONCAT44(in_register_0000000c,nMulti);
  if ((((Level < 6) && (dd->one != bVarsCol)) && (s_BackTracks < 0x65)) &&
     (s_BackTracks = s_BackTracks + 1, dd->one != bVarsCol)) {
    local_40 = (ulong)(Level - 1U);
    Degree = nMulti + -1;
    uVar1 = (ulong)(uint)Level;
    local_48 = uVar1 * 4;
    local_58 = local_40 << 0xb;
    pDVar4 = bVarsCol;
    local_60 = dd;
    do {
      local_50 = dd->vars[pDVar4->index];
      s_VarOrderCur[local_40] = pDVar4->index;
      local_38 = (DdNode *)((ulong)local_50 ^ 1);
      uVar5 = 0;
      ppDVar3 = s_Field[uVar1] + 1;
      do {
        lVar6 = local_58;
        n = ComputeVarSetAndCountMinterms
                      (dd,*(DdNode **)((long)s_Field[0] + local_58 + uVar5 * 8),local_38,&local_6c);
        Cudd_Ref(n);
        uVar2 = (ulong)local_6c;
        dVar7 = Extra_Power2(Degree);
        if (dVar7 < (double)uVar2) goto LAB_009307a0;
        n_00 = ComputeVarSetAndCountMinterms
                         (dd,*(DdNode **)((long)s_Field[0] + uVar5 * 8 + lVar6),local_50,&local_70);
        Cudd_Ref(n_00);
        uVar2 = (ulong)local_70;
        dVar7 = Extra_Power2(Degree);
        dd = local_60;
        if (dVar7 < (double)uVar2) {
          Cudd_RecursiveDeref(local_60,n);
          n = n_00;
          goto LAB_009307a0;
        }
        uVar5 = uVar5 + 1;
        (*(DdNode *(*) [256])(ppDVar3 + -1))[0] = n;
        *ppDVar3 = n_00;
        ppDVar3 = ppDVar3 + 2;
      } while ((uint)uVar5 >> ((byte)(Level - 1U) & 0x1f) == 0);
      if ((s_nVarsBest < Level) && (s_nVarsBest = Level, 0 < Level)) {
        memcpy(s_VarOrderBest,s_VarOrderCur,local_48);
      }
      if (1 < (int)local_68) {
        n = Cudd_bddExistAbstract(dd,bVarsCol,local_50);
        Cudd_Ref(n);
        EvaluateEncodings_rec(dd,n,nVarsCol + -1,Degree,Level + 1);
LAB_009307a0:
        Cudd_RecursiveDeref(dd,n);
      }
      if ((int)uVar5 != 0) {
        lVar6 = 0;
        do {
          Cudd_RecursiveDeref(dd,*(DdNode **)((long)s_Field[uVar1] + lVar6));
          Cudd_RecursiveDeref(dd,*(DdNode **)((long)(s_Field[uVar1] + 1) + lVar6));
          lVar6 = lVar6 + 0x10;
        } while ((uVar5 & 0xffffffff) << 4 != lVar6);
      }
    } while (((s_nVarsBest != 5) && (s_nVarsBest != s_MultiStart)) &&
            (pDVar4 = (pDVar4->type).kids.T, pDVar4 != dd->one));
  }
  return;
}

Assistant:

void EvaluateEncodings_rec( DdManager * dd, DdNode * bVarsCol, int nVarsCol, int nMulti, int Level )
// bVarsCol is the set of remaining variables
// nVarsCol is the number of remaining variables
// nMulti is the number of encoding variables to be used
// Level is the level of recursion, from which this function is called
// if we successfully finish this procedure, Level also stands for how many encoding variabled we saved
{
    int i, k;
    int nEntries = (1<<(Level-1)); // the number of entries in the field of the previous level
    DdNode * bVars0, * bVars1; // the cofactors
    unsigned nMint0, nMint1;   // the number of minterms
    DdNode * bTempV;
    DdNode * bVarTop;
    int fBreak;


    // there is no need to search above this level
    if ( Level > s_MaxDepth )
        return;

    // if there are no variables left, quit the research
    if ( bVarsCol == b1 )
        return;

    if ( s_BackTracks > s_BackTrackLimit )
        return;

    s_BackTracks++;

    // otherwise, go through the remaining variables
    for ( bTempV = bVarsCol; bTempV != b1; bTempV = cuddT(bTempV) )
    {
        // the currently tested variable
        bVarTop = dd->vars[bTempV->index];

        // put it into the array
        s_VarOrderCur[Level-1] = bTempV->index;

        // go through the entries and fill them out by cofactoring
        fBreak = 0;
        for ( i = 0; i < nEntries; i++ )
        {
            bVars0 = ComputeVarSetAndCountMinterms( dd, s_Field[Level-1][i], Cudd_Not(bVarTop), &nMint0 );
            Cudd_Ref( bVars0 );

            if ( nMint0 > Extra_Power2( nMulti-1 ) ) 
            {
                // there is no way to encode - dereference and return
                Cudd_RecursiveDeref( dd, bVars0 );
                fBreak = 1;
                break;
            }

            bVars1 = ComputeVarSetAndCountMinterms( dd, s_Field[Level-1][i], bVarTop, &nMint1 );
            Cudd_Ref( bVars1 );

            if ( nMint1 > Extra_Power2( nMulti-1 ) ) 
            {
                // there is no way to encode - dereference and return
                Cudd_RecursiveDeref( dd, bVars0 );
                Cudd_RecursiveDeref( dd, bVars1 );
                fBreak = 1;
                break;
            }

            // otherwise, add these two cofactors
            s_Field[Level][2*i + 0] = bVars0; // takes ref
            s_Field[Level][2*i + 1] = bVars1; // takes ref
        } 

        if ( !fBreak )
        {
            DdNode * bVarsRem;
            // if we ended up here, it means that the cofactors w.r.t. variable bVarTop satisfy the condition
            // save this situation
            if ( s_nVarsBest < Level )
            {
                s_nVarsBest = Level;
                // copy the variable assignment
                for ( k = 0; k < Level; k++ )
                    s_VarOrderBest[k] = s_VarOrderCur[k];
            }

            // call recursively
            // get the new variable set
            if ( nMulti-1 > 0 )
            {
                bVarsRem = Cudd_bddExistAbstract( dd, bVarsCol, bVarTop );   Cudd_Ref( bVarsRem );
                EvaluateEncodings_rec( dd, bVarsRem, nVarsCol-1, nMulti-1, Level+1 );
                Cudd_RecursiveDeref( dd, bVarsRem );
            }
        }

        // deref the contents of the array
        for ( k = 0; k < i; k++ )
        {
            Cudd_RecursiveDeref( dd, s_Field[Level][2*k + 0] );
            Cudd_RecursiveDeref( dd, s_Field[Level][2*k + 1] );
        }

        // if the solution is found, there is no need to continue
        if ( s_nVarsBest == s_MaxDepth )
            return;

        // if the solution is found, there is no need to continue
        if ( s_nVarsBest == s_MultiStart )
            return;
    }
    // at this point, we have tried all possible directions in the space of variables
}